

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaAllocator_T::GetAllocationInfo
          (VmaAllocator_T *this,VmaAllocation hAllocation,VmaAllocationInfo *pAllocationInfo)

{
  uint8_t uVar1;
  VmaBlockMetadata *pVVar2;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  void *pvVar6;
  VmaAllocHandle *ppVVar7;
  VkDeviceMemory pVVar8;
  VkDeviceSize VVar5;
  
  pAllocationInfo->memoryType = hAllocation->m_MemoryTypeIndex;
  uVar1 = hAllocation->m_Type;
  if (uVar1 == '\x02') {
    ppVVar7 = &(hAllocation->field_0).m_BlockAllocation.m_AllocHandle;
  }
  else {
    if (uVar1 != '\x01') {
      pVVar8 = (VkDeviceMemory)0x0;
      goto LAB_001c385f;
    }
    ppVVar7 = (VmaAllocHandle *)&((hAllocation->field_0).m_BlockAllocation.m_Block)->m_hMemory;
  }
  pVVar8 = (VkDeviceMemory)*ppVVar7;
LAB_001c385f:
  pAllocationInfo->deviceMemory = pVVar8;
  if (uVar1 == '\x01') {
    pVVar2 = ((hAllocation->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
    iVar4 = (*pVVar2->_vptr_VmaBlockMetadata[9])
                      (pVVar2,(hAllocation->field_0).m_BlockAllocation.m_AllocHandle);
    VVar5 = CONCAT44(extraout_var,iVar4);
  }
  else {
    VVar5 = 0;
  }
  pAllocationInfo->offset = VVar5;
  pAllocationInfo->size = hAllocation->m_Size;
  pvVar6 = VmaAllocation_T::GetMappedData(hAllocation);
  pAllocationInfo->pMappedData = pvVar6;
  pcVar3 = hAllocation->m_pName;
  pAllocationInfo->pUserData = hAllocation->m_pUserData;
  pAllocationInfo->pName = pcVar3;
  return;
}

Assistant:

void VmaAllocator_T::GetAllocationInfo(VmaAllocation hAllocation, VmaAllocationInfo* pAllocationInfo)
{
    pAllocationInfo->memoryType = hAllocation->GetMemoryTypeIndex();
    pAllocationInfo->deviceMemory = hAllocation->GetMemory();
    pAllocationInfo->offset = hAllocation->GetOffset();
    pAllocationInfo->size = hAllocation->GetSize();
    pAllocationInfo->pMappedData = hAllocation->GetMappedData();
    pAllocationInfo->pUserData = hAllocation->GetUserData();
    pAllocationInfo->pName = hAllocation->GetName();
}